

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

void obj_init(void)

{
  t_symbol *ptVar1;
  
  ptVar1 = gensym("inlet");
  inlet_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x30,1,A_NULL);
  class_addbang(inlet_class,inlet_bang);
  class_addpointer(inlet_class,inlet_pointer);
  class_doaddfloat(inlet_class,inlet_float);
  class_addsymbol(inlet_class,inlet_symbol);
  class_addlist(inlet_class,inlet_list);
  class_addanything(inlet_class,inlet_anything);
  ptVar1 = gensym("inlet");
  pointerinlet_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x30,1,A_NULL);
  class_addpointer(pointerinlet_class,pointerinlet_pointer);
  class_addanything(pointerinlet_class,inlet_wrong);
  ptVar1 = gensym("inlet");
  floatinlet_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x30,1,A_NULL);
  class_doaddfloat(floatinlet_class,floatinlet_float);
  class_addanything(floatinlet_class,inlet_wrong);
  ptVar1 = gensym("inlet");
  symbolinlet_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x30,1,A_NULL);
  class_addsymbol(symbolinlet_class,symbolinlet_symbol);
  class_addanything(symbolinlet_class,inlet_wrong);
  ptVar1 = gensym("backtracer");
  backtracer_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x18,1,A_NULL);
  class_addanything(backtracer_class,backtracer_anything);
  return;
}

Assistant:

void obj_init(void)
{
    inlet_class = class_new(gensym("inlet"), 0, 0,
        sizeof(t_inlet), CLASS_PD, 0);
    class_addbang(inlet_class, inlet_bang);
    class_addpointer(inlet_class, inlet_pointer);
    class_addfloat(inlet_class, inlet_float);
    class_addsymbol(inlet_class, inlet_symbol);
    class_addlist(inlet_class, inlet_list);
    class_addanything(inlet_class, inlet_anything);

    pointerinlet_class = class_new(gensym("inlet"), 0, 0,
        sizeof(t_inlet), CLASS_PD, 0);
    class_addpointer(pointerinlet_class, pointerinlet_pointer);
    class_addanything(pointerinlet_class, inlet_wrong);

    floatinlet_class = class_new(gensym("inlet"), 0, 0,
        sizeof(t_inlet), CLASS_PD, 0);
    class_addfloat(floatinlet_class, (t_method)floatinlet_float);
    class_addanything(floatinlet_class, inlet_wrong);

    symbolinlet_class = class_new(gensym("inlet"), 0, 0,
        sizeof(t_inlet), CLASS_PD, 0);
    class_addsymbol(symbolinlet_class, symbolinlet_symbol);
    class_addanything(symbolinlet_class, inlet_wrong);

    backtracer_class = class_new(gensym("backtracer"), 0, 0,
        sizeof(t_backtracer), CLASS_PD, 0);
    class_addanything(backtracer_class, backtracer_anything);

}